

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_SecureChannelManager_renew
          (UA_SecureChannelManager *cm,UA_Connection *conn,UA_OpenSecureChannelRequest *request,
          UA_OpenSecureChannelResponse *response)

{
  UA_UInt32 UVar1;
  UA_SecureChannel *pUVar2;
  UA_DateTime UVar3;
  UA_UInt32 local_3c;
  UA_SecureChannel *channel;
  UA_OpenSecureChannelResponse *response_local;
  UA_OpenSecureChannelRequest *request_local;
  UA_Connection *conn_local;
  UA_SecureChannelManager *cm_local;
  
  pUVar2 = conn->channel;
  if (pUVar2 == (UA_SecureChannel *)0x0) {
    cm_local._4_4_ = 0x80020000;
  }
  else {
    if ((pUVar2->nextSecurityToken).tokenId == 0) {
      (pUVar2->nextSecurityToken).channelId = (pUVar2->securityToken).channelId;
      UVar1 = cm->lastTokenId;
      cm->lastTokenId = UVar1 + 1;
      (pUVar2->nextSecurityToken).tokenId = UVar1;
      UVar3 = UA_DateTime_now();
      (pUVar2->nextSecurityToken).createdAt = UVar3;
      if ((cm->server->config).maxSecurityTokenLifetime < request->requestedLifetime) {
        local_3c = (cm->server->config).maxSecurityTokenLifetime;
      }
      else {
        local_3c = request->requestedLifetime;
      }
      (pUVar2->nextSecurityToken).revisedLifetime = local_3c;
      if ((pUVar2->nextSecurityToken).revisedLifetime == 0) {
        (pUVar2->nextSecurityToken).revisedLifetime = (cm->server->config).maxSecurityTokenLifetime;
      }
    }
    if ((pUVar2->clientNonce).data != (UA_Byte *)0x0) {
      UA_ByteString_deleteMembers(&pUVar2->clientNonce);
    }
    UA_ByteString_copy(&request->clientNonce,&pUVar2->clientNonce);
    UA_ByteString_copy(&pUVar2->serverNonce,&response->serverNonce);
    UA_ChannelSecurityToken_copy(&pUVar2->nextSecurityToken,&response->securityToken);
    UVar3 = UA_DateTime_nowMonotonic();
    (pUVar2->nextSecurityToken).createdAt = UVar3;
    cm_local._4_4_ = 0;
  }
  return cm_local._4_4_;
}

Assistant:

UA_StatusCode
UA_SecureChannelManager_renew(UA_SecureChannelManager *cm, UA_Connection *conn,
                              const UA_OpenSecureChannelRequest *request,
                              UA_OpenSecureChannelResponse *response) {
    UA_SecureChannel *channel = conn->channel;
    if(!channel)
        return UA_STATUSCODE_BADINTERNALERROR;

    /* if no security token is already issued */
    if(channel->nextSecurityToken.tokenId == 0) {
        channel->nextSecurityToken.channelId = channel->securityToken.channelId;
        channel->nextSecurityToken.tokenId = cm->lastTokenId++;
        channel->nextSecurityToken.createdAt = UA_DateTime_now();
        channel->nextSecurityToken.revisedLifetime =
            (request->requestedLifetime > cm->server->config.maxSecurityTokenLifetime) ?
            cm->server->config.maxSecurityTokenLifetime : request->requestedLifetime;
        if(channel->nextSecurityToken.revisedLifetime == 0) /* lifetime 0 -> return the max lifetime */
            channel->nextSecurityToken.revisedLifetime = cm->server->config.maxSecurityTokenLifetime;
    }

    /* invalidate the old nonce */
    if(channel->clientNonce.data)
        UA_ByteString_deleteMembers(&channel->clientNonce);

    /* set the response */
    UA_ByteString_copy(&request->clientNonce, &channel->clientNonce);
    UA_ByteString_copy(&channel->serverNonce, &response->serverNonce);
    UA_ChannelSecurityToken_copy(&channel->nextSecurityToken, &response->securityToken);

    /* reset the creation date to the monotonic clock */
    channel->nextSecurityToken.createdAt = UA_DateTime_nowMonotonic();

    return UA_STATUSCODE_GOOD;
}